

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse.h
# Opt level: O0

U32 FSE_bitCost(void *symbolTTPtr,U32 tableLog,U32 symbolValue,U32 accuracyLog)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  U32 bitMultiplier;
  U32 normalizedDeltaFromThreshold;
  U32 deltaFromThreshold;
  U32 tableSize;
  U32 threshold;
  U32 minNbBits;
  FSE_symbolCompressionTransform *symbolTT;
  U32 accuracyLog_local;
  U32 symbolValue_local;
  U32 tableLog_local;
  void *symbolTTPtr_local;
  
  uVar1 = *(uint *)((long)symbolTTPtr + (ulong)symbolValue * 8 + 4) >> 0x10;
  uVar2 = (uVar1 + 1) * 0x10000;
  if (0xf < tableLog) {
    __assert_fail("tableLog < 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/fse.h"
                  ,0x1f2,"U32 FSE_bitCost(const void *, U32, U32, U32)");
  }
  if (0x1f - tableLog <= accuracyLog) {
    __assert_fail("accuracyLog < 31-tableLog",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/fse.h"
                  ,499,"U32 FSE_bitCost(const void *, U32, U32, U32)");
  }
  iVar3 = 1 << ((byte)tableLog & 0x1f);
  uVar4 = (uVar2 - (*(int *)((long)symbolTTPtr + (ulong)symbolValue * 8 + 4) + iVar3) <<
          ((byte)accuracyLog & 0x1f)) >> ((byte)tableLog & 0x1f);
  uVar5 = 1 << ((byte)accuracyLog & 0x1f);
  if (uVar2 < (uint)(*(int *)((long)symbolTTPtr + (ulong)symbolValue * 8 + 4) + iVar3)) {
    __assert_fail("symbolTT[symbolValue].deltaNbBits + tableSize <= threshold",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/fse.h"
                  ,0x1f8,"U32 FSE_bitCost(const void *, U32, U32, U32)");
  }
  if (uVar4 <= uVar5) {
    return (uVar1 + 1) * uVar5 - uVar4;
  }
  __assert_fail("normalizedDeltaFromThreshold <= bitMultiplier",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/fse.h"
                ,0x1f9,"U32 FSE_bitCost(const void *, U32, U32, U32)");
}

Assistant:

MEM_STATIC U32 FSE_bitCost(const void* symbolTTPtr, U32 tableLog, U32 symbolValue, U32 accuracyLog)
{
    const FSE_symbolCompressionTransform* symbolTT = (const FSE_symbolCompressionTransform*) symbolTTPtr;
    U32 const minNbBits = symbolTT[symbolValue].deltaNbBits >> 16;
    U32 const threshold = (minNbBits+1) << 16;
    assert(tableLog < 16);
    assert(accuracyLog < 31-tableLog);  /* ensure enough room for renormalization double shift */
    {   U32 const tableSize = 1 << tableLog;
        U32 const deltaFromThreshold = threshold - (symbolTT[symbolValue].deltaNbBits + tableSize);
        U32 const normalizedDeltaFromThreshold = (deltaFromThreshold << accuracyLog) >> tableLog;   /* linear interpolation (very approximate) */
        U32 const bitMultiplier = 1 << accuracyLog;
        assert(symbolTT[symbolValue].deltaNbBits + tableSize <= threshold);
        assert(normalizedDeltaFromThreshold <= bitMultiplier);
        return (minNbBits+1)*bitMultiplier - normalizedDeltaFromThreshold;
    }
}